

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

bool __thiscall llvm::DWARFVerifier::handleDebugLine(DWARFVerifier *this)

{
  StringRef Str;
  
  this->NumDebugLineErrors = 0;
  Str.Length = 0x19;
  Str.Data = "Verifying .debug_line...\n";
  raw_ostream::operator<<(this->OS,Str);
  verifyDebugLineStmtOffsets(this);
  verifyDebugLineRows(this);
  return this->NumDebugLineErrors == 0;
}

Assistant:

bool DWARFVerifier::handleDebugLine() {
  NumDebugLineErrors = 0;
  OS << "Verifying .debug_line...\n";
  verifyDebugLineStmtOffsets();
  verifyDebugLineRows();
  return NumDebugLineErrors == 0;
}